

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void cppcms::http::response::make_error_response_html_body(int stat,ostream *out,string *msg)

{
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  ostream *in_RSI;
  int in_EDI;
  string *in_stack_ffffffffffffffb8;
  string local_38 [40];
  ostream *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  poVar1 = std::operator<<(in_RSI,
                           "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n\t\"http://www.w3.org/TR/html4/loose.dtd\">\n<html>\n  <head>\n    <title>"
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1," &mdash; ");
  pcVar2 = status_to_string(local_4);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"</title>\n  </head>\n  <body>\n    <h1>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1," &mdash; ");
  pcVar2 = status_to_string(local_4);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"</h1>\n");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar1 = std::operator<<(local_10,"    <p>");
    util::escape(in_stack_ffffffffffffffb8);
    poVar1 = std::operator<<(poVar1,local_38);
    std::operator<<(poVar1,"</p>\n");
    std::__cxx11::string::~string(local_38);
  }
  std::operator<<(local_10,"  </body>\n</html>\n");
  return;
}

Assistant:

void response::make_error_response_html_body(int stat,std::ostream &out,std::string const &msg)
{
	out   <<"<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n"
		"	\"http://www.w3.org/TR/html4/loose.dtd\">\n"
		"<html>\n"
		"  <head>\n"
		"    <title>"<<stat<<" &mdash; "<< http::response::status_to_string(stat)<<"</title>\n"
		"  </head>\n"
		"  <body>\n"
		"    <h1>"<<stat<<" &mdash; "<< http::response::status_to_string(stat)<<"</h1>\n";
	if(!msg.empty()) {
		out<<"    <p>"<<util::escape(msg)<<"</p>\n";
	}
	out  <<	"  </body>\n"
		"</html>\n";

}